

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# NeuralNetwork.pb.h
# Opt level: O2

SGDOptimizer * __thiscall CoreML::Specification::Optimizer::mutable_sgdoptimizer(Optimizer *this)

{
  SGDOptimizer *this_00;
  
  if (this->_oneof_case_[0] == 10) {
    this_00 = (this->OptimizerType_).sgdoptimizer_;
  }
  else {
    clear_OptimizerType(this);
    this->_oneof_case_[0] = 10;
    this_00 = (SGDOptimizer *)operator_new(0x30);
    SGDOptimizer::SGDOptimizer(this_00);
    (this->OptimizerType_).sgdoptimizer_ = this_00;
  }
  return this_00;
}

Assistant:

inline ::CoreML::Specification::SGDOptimizer* Optimizer::mutable_sgdoptimizer() {
  if (!has_sgdoptimizer()) {
    clear_OptimizerType();
    set_has_sgdoptimizer();
    OptimizerType_.sgdoptimizer_ = new ::CoreML::Specification::SGDOptimizer;
  }
  // @@protoc_insertion_point(field_mutable:CoreML.Specification.Optimizer.sgdOptimizer)
  return OptimizerType_.sgdoptimizer_;
}